

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.hpp
# Opt level: O3

string * duckdb::DuckDBPlatform_abi_cxx11_(void)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string postfix;
  string arch;
  string os;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"linux","");
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"amd64","");
  local_90[0] = local_80;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_90,anon_var_dwarf_4f18422 + 9);
  local_d0[0] = local_c0;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_d0,local_50,local_50 + local_48);
  ::std::__cxx11::string::append((char *)local_d0);
  plVar2 = (long *)::std::__cxx11::string::_M_append((char *)local_d0,(ulong)local_70[0]);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a0 = *plVar3;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar3;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90[0]);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&in_RDI->field_2 + 8) = lVar1;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*plVar2;
    (in_RDI->field_2)._M_allocated_capacity = *psVar4;
  }
  in_RDI->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return in_RDI;
}

Assistant:

std::string DuckDBPlatform() { // NOLINT: allow definition in header
#if defined(DUCKDB_CUSTOM_PLATFORM)
	return DUCKDB_QUOTE_DEFINE(DUCKDB_CUSTOM_PLATFORM);
#else
#if defined(DUCKDB_WASM_VERSION)
	// DuckDB-Wasm requires CUSTOM_PLATFORM to be defined
	static_assert(0, "DUCKDB_WASM_VERSION should rely on CUSTOM_PLATFORM being provided");
#endif
	std::string os = "linux";
#if INTPTR_MAX == INT64_MAX
	std::string arch = "amd64";
#elif INTPTR_MAX == INT32_MAX
	std::string arch = "i686";
#else
#error Unknown pointer size or missing size macros!
#endif
	std::string postfix = "";

#ifdef _WIN32
	os = "windows";
#elif defined(__APPLE__)
	os = "osx";
#elif defined(__FreeBSD__)
	os = "freebsd";
#endif
#if defined(__aarch64__) || defined(__ARM_ARCH_ISA_A64)
	arch = "arm64";
#endif

#if defined(__MUSL__)
	if (os == "linux") {
		postfix = "_musl";
	}
#elif (!defined(__clang__) && defined(__GNUC__) && __GNUC__ < 5) ||                                                    \
    (defined(_GLIBCXX_USE_CXX11_ABI) && _GLIBCXX_USE_CXX11_ABI == 0)
#error                                                                                                                 \
    "DuckDB does not provide extensions for this (legacy) CXX ABI - Explicitly set DUCKDB_PLATFORM (Makefile) / DUCKDB_EXPLICIT_PLATFORM (CMake) to build anyway. "
#endif

#if defined(__ANDROID__)
	postfix = "_android";
#endif
#ifdef __MINGW32__
	postfix = "_mingw";
#endif
// this is used for the windows R builds which use `mingw` equivalent extensions
#ifdef DUCKDB_PLATFORM_RTOOLS
	postfix = "_mingw";
#endif
	return os + "_" + arch + postfix;
#endif
}